

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O3

int PixarLogDecode(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  long lVar1;
  short *psVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t *puVar9;
  bool bVar10;
  long lVar11;
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 auVar29 [14];
  undefined1 auVar30 [14];
  undefined1 auVar31 [14];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  long lVar39;
  long lVar40;
  ushort uVar41;
  uint uVar42;
  ushort *puVar43;
  ulong uVar44;
  ushort uVar45;
  uint uVar46;
  char *pcVar47;
  ulong *wp;
  ushort uVar48;
  long lVar49;
  long lVar50;
  ushort uVar51;
  int iVar52;
  ulong uVar53;
  uint uVar54;
  uint uVar55;
  ulong uVar56;
  long lVar57;
  uint8_t *puVar58;
  ulong uVar59;
  ulong *puVar60;
  ushort *puVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  
  puVar9 = tif->tif_data;
  uVar46 = *(uint *)(puVar9 + 0x108);
  if (uVar46 - 2 < 3) {
    occ = (ulong)occ >> 1;
  }
  else if (1 < uVar46) {
    if (uVar46 != 5) {
      uVar41 = (tif->tif_dir).td_bitspersample;
      pcVar47 = "%u bit input not supported in PixarLog";
LAB_002ab9e5:
      TIFFErrorExtR(tif,"PixarLogDecode",pcVar47,(ulong)uVar41);
      return 0;
    }
    occ = (ulong)occ >> 2;
  }
  uVar46 = (uint)*(ushort *)(puVar9 + 0x100) * (tif->tif_dir).td_imagewidth;
  *(uint8_t **)(puVar9 + 0x80) = tif->tif_rawcp;
  *(int *)(puVar9 + 0x88) = (int)tif->tif_rawcc;
  *(undefined8 *)(puVar9 + 0x98) = *(undefined8 *)(puVar9 + 0xf8);
  uVar59 = occ * 2;
  *(int *)(puVar9 + 0xa0) = (int)uVar59;
  if (uVar59 >> 0x20 == 0) {
    if (uVar59 - *(long *)(puVar9 + 0xf0) == 0 || (long)uVar59 < *(long *)(puVar9 + 0xf0)) {
      do {
        iVar35 = inflate((z_streamp)(puVar9 + 0x80),1);
        if (iVar35 != 0) {
          if (iVar35 != 1) {
            if (iVar35 == -3) {
              pcVar47 = "(null)";
              if (*(char **)(puVar9 + 0xb0) != (char *)0x0) {
                pcVar47 = *(char **)(puVar9 + 0xb0);
              }
              TIFFErrorExtR(tif,"PixarLogDecode","Decoding error at scanline %u, %s",
                            (ulong)tif->tif_row,pcVar47);
              return 0;
            }
            pcVar47 = "(null)";
            if (*(char **)(puVar9 + 0xb0) != (char *)0x0) {
              pcVar47 = *(char **)(puVar9 + 0xb0);
            }
            TIFFErrorExtR(tif,"PixarLogDecode","ZLib error: %s",pcVar47);
            return 0;
          }
          if (*(int *)(puVar9 + 0xa0) != 0) {
            TIFFErrorExtR(tif,"PixarLogDecode","Not enough data at scanline %u (short %u bytes)",
                          (ulong)tif->tif_row);
            return 0;
          }
          break;
        }
      } while (*(int *)(puVar9 + 0xa0) != 0);
      tif->tif_rawcp = *(uint8_t **)(puVar9 + 0x80);
      tif->tif_rawcc = (ulong)*(uint *)(puVar9 + 0x88);
      wp = *(ulong **)(puVar9 + 0xf8);
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabArrayOfShort((uint16_t *)wp,occ);
      }
      lVar49 = (long)(int)uVar46;
      if (occ % lVar49 != 0) {
        TIFFWarningExtR(tif,"PixarLogDecode",
                        "stride %d is not a multiple of sample count, %ld, data truncated.");
        occ = occ - occ % lVar49;
      }
      auVar34 = _DAT_00331bc0;
      auVar33 = _DAT_00331ba0;
      auVar32 = _DAT_00331b80;
      if (0 < occ) {
        lVar11 = lVar49 * 2;
        lVar1 = lVar49 * 4;
        uVar36 = uVar46 + 4;
        puVar43 = (ushort *)((long)wp + 10);
        uVar37 = uVar46 + 3;
        lVar50 = 0;
        do {
          lVar40 = lVar49;
          switch(*(undefined4 *)(puVar9 + 0x108)) {
          case 0:
            uVar41 = *(ushort *)(puVar9 + 0x100);
            if ((int)(uint)uVar41 <= (int)uVar46) {
              lVar57 = *(long *)(puVar9 + 0x130);
              uVar42 = (uint)uVar41;
              if (uVar42 == 3) {
                uVar53 = (ulong)(ushort)*wp & 0x7ff;
                *op = *(uint8_t *)(lVar57 + uVar53);
                uVar44 = (ulong)*(ushort *)((long)wp + 2) & 0x7ff;
                *(uint8_t *)((long)op + 1) = *(uint8_t *)(lVar57 + uVar44);
                uVar59 = (ulong)*(ushort *)((long)wp + 4) & 0x7ff;
                *(uint8_t *)((long)op + 2) = *(uint8_t *)(lVar57 + uVar59);
                if (3 < uVar46) {
                  lVar39 = 5;
                  uVar42 = uVar37;
                  do {
                    uVar38 = (int)uVar53 + (uint)*(ushort *)((long)wp + lVar39 * 2 + -4);
                    uVar53 = (ulong)uVar38;
                    *(uint8_t *)((long)op + lVar39 + -2) =
                         *(uint8_t *)(lVar57 + (ulong)(uVar38 & 0x7ff));
                    uVar38 = (int)uVar44 + (uint)*(ushort *)((long)wp + lVar39 * 2 + -2);
                    uVar44 = (ulong)uVar38;
                    *(uint8_t *)((long)op + lVar39 + -1) =
                         *(uint8_t *)(lVar57 + (ulong)(uVar38 & 0x7ff));
                    uVar38 = (int)uVar59 + (uint)*(ushort *)((long)wp + lVar39 * 2);
                    uVar59 = (ulong)uVar38;
                    *(uint8_t *)((long)op + lVar39) = *(uint8_t *)(lVar57 + (ulong)(uVar38 & 0x7ff))
                    ;
                    lVar39 = lVar39 + 3;
                    uVar42 = uVar42 - 3;
                  } while (6 < uVar42);
                }
              }
              else if (uVar42 == 4) {
                uVar53 = (ulong)(ushort)*wp & 0x7ff;
                *op = *(uint8_t *)(lVar57 + uVar53);
                uVar56 = (ulong)*(ushort *)((long)wp + 2) & 0x7ff;
                *(uint8_t *)((long)op + 1) = *(uint8_t *)(lVar57 + uVar56);
                uVar44 = (ulong)*(ushort *)((long)wp + 4) & 0x7ff;
                *(uint8_t *)((long)op + 2) = *(uint8_t *)(lVar57 + uVar44);
                uVar59 = (ulong)*(ushort *)((long)wp + 6) & 0x7ff;
                *(uint8_t *)((long)op + 3) = *(uint8_t *)(lVar57 + uVar59);
                if (4 < uVar46) {
                  lVar39 = 7;
                  uVar42 = uVar36;
                  do {
                    uVar38 = (int)uVar53 + (uint)*(ushort *)((long)wp + lVar39 * 2 + -6);
                    uVar53 = (ulong)uVar38;
                    *(uint8_t *)((long)op + lVar39 + -3) =
                         *(uint8_t *)(lVar57 + (ulong)(uVar38 & 0x7ff));
                    uVar38 = (int)uVar56 + (uint)*(ushort *)((long)wp + lVar39 * 2 + -4);
                    uVar56 = (ulong)uVar38;
                    *(uint8_t *)((long)op + lVar39 + -2) =
                         *(uint8_t *)(lVar57 + (ulong)(uVar38 & 0x7ff));
                    uVar38 = (int)uVar44 + (uint)*(ushort *)((long)wp + lVar39 * 2 + -2);
                    uVar44 = (ulong)uVar38;
                    *(uint8_t *)((long)op + lVar39 + -1) =
                         *(uint8_t *)(lVar57 + (ulong)(uVar38 & 0x7ff));
                    uVar38 = (int)uVar59 + (uint)*(ushort *)((long)wp + lVar39 * 2);
                    uVar59 = (ulong)uVar38;
                    *(uint8_t *)((long)op + lVar39) = *(uint8_t *)(lVar57 + (ulong)(uVar38 & 0x7ff))
                    ;
                    lVar39 = lVar39 + 4;
                    uVar42 = uVar42 - 4;
                  } while (8 < uVar42);
                }
              }
              else {
                uVar55 = uVar41 + 1;
                puVar60 = wp;
                puVar61 = (ushort *)op;
                uVar38 = uVar55;
                do {
                  *(uint8_t *)puVar61 = *(uint8_t *)(lVar57 + (ulong)((ushort)*puVar60 & 0x7ff));
                  puVar60 = (ulong *)((long)puVar60 + 2);
                  puVar61 = (ushort *)((long)puVar61 + 1);
                  uVar38 = uVar38 - 1;
                } while (1 < uVar38);
                if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
                  uVar38 = uVar55;
                  iVar35 = uVar46 - uVar42;
                  do {
                    do {
                      psVar2 = (short *)((long)puVar60 + (ulong)uVar41 * 2);
                      *psVar2 = *psVar2 + (short)*puVar60;
                      *(uint8_t *)puVar61 = *(uint8_t *)(lVar57 + (ulong)((ushort)*puVar60 & 0x7ff))
                      ;
                      puVar60 = (ulong *)((long)puVar60 + 2);
                      puVar61 = (ushort *)((long)puVar61 + 1);
                      uVar38 = uVar38 - 1;
                    } while (1 < (int)uVar38);
                    iVar52 = iVar35 - (uint)uVar41;
                    bVar10 = (int)(uint)uVar41 <= iVar35;
                    uVar38 = uVar55;
                    iVar35 = iVar52;
                  } while (iVar52 != 0 && bVar10);
                }
              }
            }
            break;
          case 1:
            uVar41 = *(ushort *)(puVar9 + 0x100);
            if ((int)(uint)uVar41 <= (int)uVar46) {
              lVar57 = *(long *)(puVar9 + 0x130);
              uVar42 = (uint)uVar41;
              if (uVar42 == 3) {
                *op = '\0';
                uVar53 = (ulong)*(ushort *)((long)wp + 4) & 0x7ff;
                uVar44 = (ulong)*(ushort *)((long)wp + 2) & 0x7ff;
                uVar59 = (ulong)(ushort)*wp & 0x7ff;
                uVar6 = *(uint8_t *)(lVar57 + uVar44);
                uVar7 = *(uint8_t *)(lVar57 + uVar59);
                *(uint8_t *)((long)op + 1) = *(uint8_t *)(lVar57 + uVar53);
                *(uint8_t *)((long)op + 2) = uVar6;
                *(uint8_t *)((long)op + 3) = uVar7;
                if (3 < uVar46) {
                  puVar58 = (uint8_t *)((long)op + 7);
                  puVar61 = puVar43;
                  uVar42 = uVar37;
                  do {
                    puVar58[-3] = '\0';
                    uVar55 = (int)uVar53 + (uint)*puVar61;
                    uVar53 = (ulong)uVar55;
                    uVar38 = (int)uVar44 + (uint)puVar61[-1];
                    uVar44 = (ulong)uVar38;
                    uVar6 = *(uint8_t *)(lVar57 + (ulong)(uVar38 & 0x7ff));
                    uVar38 = (int)uVar59 + (uint)puVar61[-2];
                    uVar59 = (ulong)uVar38;
                    uVar7 = *(uint8_t *)(lVar57 + (ulong)(uVar38 & 0x7ff));
                    puVar58[-2] = *(uint8_t *)(lVar57 + (ulong)(uVar55 & 0x7ff));
                    puVar58[-1] = uVar6;
                    *puVar58 = uVar7;
                    puVar61 = puVar61 + 3;
                    uVar42 = uVar42 - 3;
                    puVar58 = puVar58 + 4;
                  } while (6 < uVar42);
                }
              }
              else if (uVar42 == 4) {
                auVar66._8_8_ = 0;
                auVar66._0_8_ = *wp;
                auVar66 = auVar66 & auVar32;
                uVar6 = *(uint8_t *)(lVar57 + (ulong)auVar66._4_2_);
                uVar7 = *(uint8_t *)(lVar57 + (ulong)auVar66._2_2_);
                uVar8 = *(uint8_t *)(lVar57 + (ulong)auVar66._0_2_);
                *op = *(uint8_t *)(lVar57 + (ulong)auVar66._6_2_);
                *(uint8_t *)((long)op + 1) = uVar6;
                *(uint8_t *)((long)op + 2) = uVar7;
                *(uint8_t *)((long)op + 3) = uVar8;
                if (4 < uVar46) {
                  auVar14._10_2_ = 0;
                  auVar14._0_10_ = auVar66._0_10_;
                  auVar14._12_2_ = auVar66._6_2_;
                  auVar20._8_2_ = auVar66._4_2_;
                  auVar20._0_8_ = auVar66._0_8_;
                  auVar20._10_4_ = auVar14._10_4_;
                  auVar28._6_8_ = 0;
                  auVar28._0_6_ = auVar20._8_6_;
                  auVar67._6_8_ = SUB148(auVar28 << 0x40,6);
                  auVar67._4_2_ = auVar66._2_2_;
                  auVar67._2_2_ = 0;
                  auVar67._0_2_ = auVar66._0_2_;
                  auVar67._14_2_ = 0;
                  lVar39 = 4;
                  uVar42 = uVar36;
                  do {
                    uVar59 = *(ulong *)((long)wp + lVar39 * 2);
                    auVar15._8_4_ = 0;
                    auVar15._0_8_ = uVar59;
                    auVar15._12_2_ = (short)(uVar59 >> 0x30);
                    auVar21._8_2_ = (short)(uVar59 >> 0x20);
                    auVar21._0_8_ = uVar59;
                    auVar21._10_4_ = auVar15._10_4_;
                    auVar29._6_8_ = 0;
                    auVar29._0_6_ = auVar21._8_6_;
                    auVar68._0_4_ = auVar67._0_4_ + (uint)(ushort)uVar59;
                    auVar68._4_4_ =
                         auVar67._4_4_ +
                         (int)CONCAT82(SUB148(auVar29 << 0x40,6),(short)(uVar59 >> 0x10));
                    auVar68._8_4_ = auVar67._8_4_ + auVar21._8_4_;
                    auVar68._12_4_ = auVar67._12_4_ + (auVar15._10_4_ >> 0x10);
                    uVar6 = *(uint8_t *)(lVar57 + (ulong)(auVar68._8_4_ & 0x7ff));
                    uVar7 = *(uint8_t *)(lVar57 + (ulong)(auVar68._4_4_ & 0x7ff));
                    uVar8 = *(uint8_t *)(lVar57 + (ulong)(auVar68._0_4_ & 0x7ff));
                    *(uint8_t *)((long)op + lVar39) =
                         *(uint8_t *)(lVar57 + (ulong)(auVar68._12_4_ & 0x7ff));
                    *(uint8_t *)((long)op + lVar39 + 1) = uVar6;
                    *(uint8_t *)((long)op + lVar39 + 2) = uVar7;
                    *(uint8_t *)((long)op + lVar39 + 3) = uVar8;
                    lVar39 = lVar39 + 4;
                    uVar42 = uVar42 - 4;
                    auVar67 = auVar68;
                  } while (8 < uVar42);
                }
              }
              else {
                uVar55 = uVar41 + 1;
                puVar60 = wp;
                puVar61 = (ushort *)op;
                uVar38 = uVar55;
                do {
                  *(uint8_t *)puVar61 = *(uint8_t *)(lVar57 + (ulong)((ushort)*puVar60 & 0x7ff));
                  puVar60 = (ulong *)((long)puVar60 + 2);
                  puVar61 = (ushort *)((long)puVar61 + 1);
                  uVar38 = uVar38 - 1;
                } while (1 < uVar38);
                if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
                  uVar38 = uVar55;
                  iVar35 = uVar46 - uVar42;
                  do {
                    do {
                      psVar2 = (short *)((long)puVar60 + (ulong)uVar41 * 2);
                      *psVar2 = *psVar2 + (short)*puVar60;
                      *(uint8_t *)puVar61 = *(uint8_t *)(lVar57 + (ulong)((ushort)*puVar60 & 0x7ff))
                      ;
                      puVar60 = (ulong *)((long)puVar60 + 2);
                      puVar61 = (ushort *)((long)puVar61 + 1);
                      uVar38 = uVar38 - 1;
                    } while (1 < (int)uVar38);
                    iVar52 = iVar35 - (uint)uVar41;
                    bVar10 = (int)(uint)uVar41 <= iVar35;
                    uVar38 = uVar55;
                    iVar35 = iVar52;
                  } while (iVar52 != 0 && bVar10);
                }
              }
            }
            break;
          case 2:
            uVar41 = *(ushort *)(puVar9 + 0x100);
            lVar40 = lVar11;
            if ((int)(uint)uVar41 <= (int)uVar46) {
              uVar42 = (uint)uVar41;
              if (uVar42 == 3) {
                *(ushort *)op = (ushort)*wp;
                *(ushort *)((long)op + 2) = *(ushort *)((long)wp + 2);
                uVar41 = *(ushort *)((long)wp + 4);
                *(ushort *)((long)op + 4) = uVar41;
                if (3 < uVar46) {
                  uVar48 = (ushort)*wp;
                  uVar45 = *(ushort *)((long)wp + 2);
                  lVar57 = 10;
                  uVar42 = uVar37;
                  do {
                    uVar48 = uVar48 + *(short *)((long)wp + lVar57 + -4);
                    *(ushort *)((long)op + lVar57 + -4) = uVar48 & 0x7ff;
                    uVar45 = uVar45 + *(short *)((long)wp + lVar57 + -2);
                    *(ushort *)((long)op + lVar57 + -2) = uVar45 & 0x7ff;
                    uVar41 = uVar41 + *(short *)((long)wp + lVar57);
                    *(ushort *)((long)op + lVar57) = uVar41 & 0x7ff;
                    lVar57 = lVar57 + 6;
                    uVar42 = uVar42 - 3;
                  } while (6 < uVar42);
                }
              }
              else if (uVar42 == 4) {
                *(ushort *)op = (ushort)*wp;
                *(ushort *)((long)op + 2) = *(ushort *)((long)wp + 2);
                *(ushort *)((long)op + 4) = *(ushort *)((long)wp + 4);
                uVar41 = *(ushort *)((long)wp + 6);
                *(ushort *)((long)op + 6) = uVar41;
                if (4 < uVar46) {
                  uVar48 = *(ushort *)((long)wp + 4);
                  uVar45 = (ushort)*wp;
                  uVar51 = *(ushort *)((long)wp + 2);
                  lVar57 = 0xe;
                  uVar42 = uVar36;
                  do {
                    uVar45 = uVar45 + *(short *)((long)wp + lVar57 + -6);
                    *(ushort *)((long)op + lVar57 + -6) = uVar45 & 0x7ff;
                    uVar51 = uVar51 + *(short *)((long)wp + lVar57 + -4);
                    *(ushort *)((long)op + lVar57 + -4) = uVar51 & 0x7ff;
                    uVar48 = uVar48 + *(short *)((long)wp + lVar57 + -2);
                    *(ushort *)((long)op + lVar57 + -2) = uVar48 & 0x7ff;
                    uVar41 = uVar41 + *(short *)((long)wp + lVar57);
                    *(ushort *)((long)op + lVar57) = uVar41 & 0x7ff;
                    lVar57 = lVar57 + 8;
                    uVar42 = uVar42 - 4;
                  } while (8 < uVar42);
                }
              }
              else {
                uVar55 = uVar41 + 1;
                puVar61 = (ushort *)op;
                puVar60 = wp;
                uVar38 = uVar55;
                do {
                  *puVar61 = (ushort)*puVar60 & 0x7ff;
                  puVar60 = (ulong *)((long)puVar60 + 2);
                  puVar61 = puVar61 + 1;
                  uVar38 = uVar38 - 1;
                } while (1 < uVar38);
                if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
                  uVar38 = uVar55;
                  iVar35 = uVar46 - uVar42;
                  do {
                    do {
                      psVar2 = (short *)((long)puVar60 + (ulong)uVar41 * 2);
                      *psVar2 = *psVar2 + (short)*puVar60;
                      *puVar61 = (ushort)*puVar60 & 0x7ff;
                      puVar60 = (ulong *)((long)puVar60 + 2);
                      puVar61 = puVar61 + 1;
                      uVar38 = uVar38 - 1;
                    } while (1 < (int)uVar38);
                    iVar52 = iVar35 - (uint)uVar41;
                    bVar10 = (int)(uint)uVar41 <= iVar35;
                    uVar38 = uVar55;
                    iVar35 = iVar52;
                  } while (iVar52 != 0 && bVar10);
                }
              }
            }
            break;
          case 3:
            uVar41 = *(ushort *)(puVar9 + 0x100);
            lVar40 = lVar11;
            if ((int)(uint)uVar41 <= (int)uVar46) {
              lVar57 = *(long *)(puVar9 + 0x120);
              uVar42 = (uint)uVar41;
              if (uVar42 == 3) {
                uVar53 = (ulong)(ushort)*wp & 0x7ff;
                uVar44 = (ulong)*(ushort *)((long)wp + 2) & 0x7ff;
                uVar59 = (ulong)*(ushort *)((long)wp + 4) & 0x7ff;
                fVar62 = *(float *)(lVar57 + uVar59 * 4) * 2048.0;
                auVar77._0_4_ = *(float *)(lVar57 + uVar53 * 4) * 2048.0;
                auVar77._4_4_ = *(float *)(lVar57 + uVar44 * 4) * 2048.0;
                auVar77._8_8_ = 0;
                auVar69 = minps(auVar77,auVar34);
                auVar75._0_4_ = (int)auVar69._0_4_;
                auVar75._4_4_ = (int)auVar69._4_4_;
                auVar75._8_4_ = (int)auVar69._8_4_;
                auVar75._12_4_ = (int)auVar69._12_4_;
                auVar69 = pshuflw(auVar75,auVar75,0xe8);
                if (3071.0 <= fVar62) {
                  fVar62 = 3071.0;
                }
                *(int *)op = auVar69._0_4_;
                *(ushort *)((long)op + 4) = (ushort)(int)fVar62;
                if (3 < uVar46) {
                  lVar39 = 10;
                  uVar42 = uVar37;
                  do {
                    uVar54 = (int)uVar53 + (uint)*(ushort *)((long)wp + lVar39 + -4);
                    uVar53 = (ulong)uVar54;
                    uVar55 = (int)uVar44 + (uint)*(ushort *)((long)wp + lVar39 + -2);
                    uVar44 = (ulong)uVar55;
                    uVar38 = (int)uVar59 + (uint)*(ushort *)((long)wp + lVar39);
                    uVar59 = (ulong)uVar38;
                    fVar62 = *(float *)(lVar57 + (ulong)(uVar38 & 0x7ff) * 4) * 2048.0;
                    auVar78._0_4_ = *(float *)(lVar57 + (ulong)(uVar54 & 0x7ff) * 4) * 2048.0;
                    auVar78._4_4_ = *(float *)(lVar57 + (ulong)(uVar55 & 0x7ff) * 4) * 2048.0;
                    auVar78._8_8_ = 0;
                    auVar69 = minps(auVar78,auVar34);
                    auVar76._0_4_ = (int)auVar69._0_4_;
                    auVar76._4_4_ = (int)auVar69._4_4_;
                    auVar76._8_4_ = (int)auVar69._8_4_;
                    auVar76._12_4_ = (int)auVar69._12_4_;
                    auVar69 = pshuflw(auVar76,auVar76,0xe8);
                    *(int *)((long)op + lVar39 + -4) = auVar69._0_4_;
                    if (3071.0 <= fVar62) {
                      fVar62 = 3071.0;
                    }
                    *(short *)((long)op + lVar39) = (short)(int)fVar62;
                    lVar39 = lVar39 + 6;
                    uVar42 = uVar42 - 3;
                  } while (6 < uVar42);
                }
              }
              else if (uVar42 == 4) {
                auVar63._8_8_ = 0;
                auVar63._0_8_ = *wp;
                auVar63 = auVar63 & auVar32;
                auVar79._0_4_ = *(float *)(lVar57 + (ulong)auVar63._0_2_ * 4) * 2048.0;
                auVar79._4_4_ = *(float *)(lVar57 + (ulong)auVar63._2_2_ * 4) * 2048.0;
                auVar79._8_4_ = *(float *)(lVar57 + (ulong)auVar63._4_2_ * 4) * 2048.0;
                auVar79._12_4_ = *(float *)(lVar57 + (ulong)auVar63._6_2_ * 4) * 2048.0;
                auVar69 = minps(auVar79,auVar33);
                auVar72._0_4_ = (int)auVar69._0_4_;
                auVar72._4_4_ = (int)auVar69._4_4_;
                auVar72._8_4_ = (int)auVar69._8_4_;
                auVar72._12_4_ = (int)auVar69._12_4_;
                auVar69 = pshuflw(auVar72,auVar72,0xe8);
                auVar69 = pshufhw(auVar69,auVar69,0xe8);
                *(ulong *)op = CONCAT44(auVar69._8_4_,auVar69._0_4_);
                if (4 < uVar46) {
                  auVar12._10_2_ = 0;
                  auVar12._0_10_ = auVar63._0_10_;
                  auVar12._12_2_ = auVar63._6_2_;
                  auVar18._8_2_ = auVar63._4_2_;
                  auVar18._0_8_ = auVar63._0_8_;
                  auVar18._10_4_ = auVar12._10_4_;
                  auVar26._6_8_ = 0;
                  auVar26._0_6_ = auVar18._8_6_;
                  auVar24._4_2_ = auVar63._2_2_;
                  auVar24._0_4_ = auVar63._0_4_;
                  auVar24._6_8_ = SUB148(auVar26 << 0x40,6);
                  auVar64._0_4_ = auVar63._0_4_ & 0xffff;
                  auVar64._4_10_ = auVar24._4_10_;
                  auVar64._14_2_ = 0;
                  lVar39 = 8;
                  uVar42 = uVar36;
                  do {
                    uVar59 = *(ulong *)((long)wp + lVar39);
                    auVar13._8_4_ = 0;
                    auVar13._0_8_ = uVar59;
                    auVar13._12_2_ = (short)(uVar59 >> 0x30);
                    auVar19._8_2_ = (short)(uVar59 >> 0x20);
                    auVar19._0_8_ = uVar59;
                    auVar19._10_4_ = auVar13._10_4_;
                    auVar27._6_8_ = 0;
                    auVar27._0_6_ = auVar19._8_6_;
                    auVar25._4_2_ = (short)(uVar59 >> 0x10);
                    auVar25._0_4_ = (uint)uVar59;
                    auVar25._6_8_ = SUB148(auVar27 << 0x40,6);
                    auVar65._0_4_ = auVar64._0_4_ + ((uint)uVar59 & 0xffff);
                    auVar65._4_4_ = auVar64._4_4_ + auVar25._4_4_;
                    auVar65._8_4_ = auVar64._8_4_ + auVar19._8_4_;
                    auVar65._12_4_ = auVar64._12_4_ + (auVar13._10_4_ >> 0x10);
                    auVar73._0_4_ = *(float *)(lVar57 + (ulong)(auVar65._0_4_ & 0x7ff) * 4) * 2048.0
                    ;
                    auVar73._4_4_ = *(float *)(lVar57 + (ulong)(auVar65._4_4_ & 0x7ff) * 4) * 2048.0
                    ;
                    auVar73._8_4_ = *(float *)(lVar57 + (ulong)(auVar65._8_4_ & 0x7ff) * 4) * 2048.0
                    ;
                    auVar73._12_4_ =
                         *(float *)(lVar57 + (ulong)(auVar65._12_4_ & 0x7ff) * 4) * 2048.0;
                    auVar69 = minps(auVar73,auVar33);
                    auVar74._0_4_ = (int)auVar69._0_4_;
                    auVar74._4_4_ = (int)auVar69._4_4_;
                    auVar74._8_4_ = (int)auVar69._8_4_;
                    auVar74._12_4_ = (int)auVar69._12_4_;
                    auVar69 = pshuflw(auVar74,auVar74,0xe8);
                    auVar69 = pshufhw(auVar69,auVar69,0xe8);
                    *(ulong *)((long)op + lVar39) = CONCAT44(auVar69._8_4_,auVar69._0_4_);
                    lVar39 = lVar39 + 8;
                    uVar42 = uVar42 - 4;
                    auVar64 = auVar65;
                  } while (8 < uVar42);
                }
              }
              else {
                uVar55 = uVar41 + 1;
                puVar60 = wp;
                puVar61 = (ushort *)op;
                uVar38 = uVar55;
                do {
                  fVar62 = *(float *)(lVar57 + (ulong)((ushort)*puVar60 & 0x7ff) * 4) * 2048.0;
                  if (3071.0 <= fVar62) {
                    fVar62 = 3071.0;
                  }
                  *puVar61 = (ushort)(int)fVar62;
                  puVar60 = (ulong *)((long)puVar60 + 2);
                  puVar61 = puVar61 + 1;
                  uVar38 = uVar38 - 1;
                } while (1 < uVar38);
                if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
                  uVar38 = uVar55;
                  iVar35 = uVar46 - uVar42;
                  do {
                    uVar48 = *(short *)((long)puVar60 + (ulong)uVar41 * 2) + (short)*puVar60;
                    *(ushort *)((long)puVar60 + (ulong)uVar41 * 2) = uVar48;
                    fVar62 = *(float *)(lVar57 + (ulong)(uVar48 & 0x7ff) * 4) * 2048.0;
                    if (3071.0 <= fVar62) {
                      fVar62 = 3071.0;
                    }
                    *puVar61 = (ushort)(int)fVar62;
                    puVar60 = (ulong *)((long)puVar60 + 2);
                    puVar61 = puVar61 + 1;
                    uVar38 = uVar38 - 1;
                  } while ((1 < (int)uVar38) ||
                          (iVar52 = iVar35 - (uint)uVar41, bVar10 = (int)(uint)uVar41 <= iVar35,
                          uVar38 = uVar55, iVar35 = iVar52, iVar52 != 0 && bVar10));
                }
              }
            }
            break;
          case 4:
            uVar41 = *(ushort *)(puVar9 + 0x100);
            lVar40 = lVar11;
            if ((int)(uint)uVar41 <= (int)uVar46) {
              lVar57 = *(long *)(puVar9 + 0x128);
              uVar42 = (uint)uVar41;
              if (uVar42 == 3) {
                uVar53 = (ulong)(ushort)*wp & 0x7ff;
                *(ushort *)op = *(ushort *)(lVar57 + uVar53 * 2);
                uVar44 = (ulong)*(ushort *)((long)wp + 2) & 0x7ff;
                *(ushort *)((long)op + 2) = *(ushort *)(lVar57 + uVar44 * 2);
                uVar59 = (ulong)*(ushort *)((long)wp + 4) & 0x7ff;
                *(ushort *)((long)op + 4) = *(ushort *)(lVar57 + uVar59 * 2);
                if (3 < uVar46) {
                  lVar39 = 10;
                  uVar42 = uVar37;
                  do {
                    uVar38 = (int)uVar53 + (uint)*(ushort *)((long)wp + lVar39 + -4);
                    uVar53 = (ulong)uVar38;
                    *(undefined2 *)((long)op + lVar39 + -4) =
                         *(undefined2 *)(lVar57 + (ulong)(uVar38 & 0x7ff) * 2);
                    uVar38 = (int)uVar44 + (uint)*(ushort *)((long)wp + lVar39 + -2);
                    uVar44 = (ulong)uVar38;
                    *(undefined2 *)((long)op + lVar39 + -2) =
                         *(undefined2 *)(lVar57 + (ulong)(uVar38 & 0x7ff) * 2);
                    uVar38 = (int)uVar59 + (uint)*(ushort *)((long)wp + lVar39);
                    uVar59 = (ulong)uVar38;
                    *(undefined2 *)((long)op + lVar39) =
                         *(undefined2 *)(lVar57 + (ulong)(uVar38 & 0x7ff) * 2);
                    lVar39 = lVar39 + 6;
                    uVar42 = uVar42 - 3;
                  } while (6 < uVar42);
                }
              }
              else if (uVar42 == 4) {
                uVar53 = (ulong)(ushort)*wp & 0x7ff;
                *(ushort *)op = *(ushort *)(lVar57 + uVar53 * 2);
                uVar56 = (ulong)*(ushort *)((long)wp + 2) & 0x7ff;
                *(ushort *)((long)op + 2) = *(ushort *)(lVar57 + uVar56 * 2);
                uVar44 = (ulong)*(ushort *)((long)wp + 4) & 0x7ff;
                *(ushort *)((long)op + 4) = *(ushort *)(lVar57 + uVar44 * 2);
                uVar59 = (ulong)*(ushort *)((long)wp + 6) & 0x7ff;
                *(ushort *)((long)op + 6) = *(ushort *)(lVar57 + uVar59 * 2);
                if (4 < uVar46) {
                  lVar39 = 0xe;
                  uVar42 = uVar36;
                  do {
                    uVar38 = (int)uVar53 + (uint)*(ushort *)((long)wp + lVar39 + -6);
                    uVar53 = (ulong)uVar38;
                    *(undefined2 *)((long)op + lVar39 + -6) =
                         *(undefined2 *)(lVar57 + (ulong)(uVar38 & 0x7ff) * 2);
                    uVar38 = (int)uVar56 + (uint)*(ushort *)((long)wp + lVar39 + -4);
                    uVar56 = (ulong)uVar38;
                    *(undefined2 *)((long)op + lVar39 + -4) =
                         *(undefined2 *)(lVar57 + (ulong)(uVar38 & 0x7ff) * 2);
                    uVar38 = (int)uVar44 + (uint)*(ushort *)((long)wp + lVar39 + -2);
                    uVar44 = (ulong)uVar38;
                    *(undefined2 *)((long)op + lVar39 + -2) =
                         *(undefined2 *)(lVar57 + (ulong)(uVar38 & 0x7ff) * 2);
                    uVar38 = (int)uVar59 + (uint)*(ushort *)((long)wp + lVar39);
                    uVar59 = (ulong)uVar38;
                    *(undefined2 *)((long)op + lVar39) =
                         *(undefined2 *)(lVar57 + (ulong)(uVar38 & 0x7ff) * 2);
                    lVar39 = lVar39 + 8;
                    uVar42 = uVar42 - 4;
                  } while (8 < uVar42);
                }
              }
              else {
                uVar55 = uVar41 + 1;
                puVar60 = wp;
                puVar61 = (ushort *)op;
                uVar38 = uVar55;
                do {
                  *puVar61 = *(ushort *)(lVar57 + (ulong)((ushort)*puVar60 & 0x7ff) * 2);
                  puVar60 = (ulong *)((long)puVar60 + 2);
                  puVar61 = puVar61 + 1;
                  uVar38 = uVar38 - 1;
                } while (1 < uVar38);
                if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
                  uVar38 = uVar55;
                  iVar35 = uVar46 - uVar42;
                  do {
                    do {
                      psVar2 = (short *)((long)puVar60 + (ulong)uVar41 * 2);
                      *psVar2 = *psVar2 + (short)*puVar60;
                      *puVar61 = *(ushort *)(lVar57 + (ulong)((ushort)*puVar60 & 0x7ff) * 2);
                      puVar60 = (ulong *)((long)puVar60 + 2);
                      puVar61 = puVar61 + 1;
                      uVar38 = uVar38 - 1;
                    } while (1 < (int)uVar38);
                    iVar52 = iVar35 - (uint)uVar41;
                    bVar10 = (int)(uint)uVar41 <= iVar35;
                    uVar38 = uVar55;
                    iVar35 = iVar52;
                  } while (iVar52 != 0 && bVar10);
                }
              }
            }
            break;
          case 5:
            uVar41 = *(ushort *)(puVar9 + 0x100);
            lVar40 = lVar1;
            if ((int)(uint)uVar41 <= (int)uVar46) {
              lVar57 = *(long *)(puVar9 + 0x120);
              uVar42 = (uint)uVar41;
              if (uVar42 == 3) {
                uVar53 = (ulong)(ushort)*wp & 0x7ff;
                uVar44 = (ulong)*(ushort *)((long)wp + 2) & 0x7ff;
                uVar59 = (ulong)*(ushort *)((long)wp + 4) & 0x7ff;
                uVar4 = *(undefined4 *)(lVar57 + uVar44 * 4);
                uVar3 = *(undefined4 *)(lVar57 + uVar59 * 4);
                *(undefined4 *)op = *(undefined4 *)(lVar57 + uVar53 * 4);
                *(undefined4 *)((long)op + 4) = uVar4;
                *(undefined4 *)((long)op + 8) = uVar3;
                if (3 < uVar46) {
                  lVar39 = 10;
                  uVar42 = uVar37;
                  do {
                    uVar55 = (int)uVar53 + (uint)*(ushort *)((long)wp + lVar39 + -4);
                    uVar53 = (ulong)uVar55;
                    uVar38 = (int)uVar44 + (uint)*(ushort *)((long)wp + lVar39 + -2);
                    uVar44 = (ulong)uVar38;
                    uVar4 = *(undefined4 *)(lVar57 + (ulong)(uVar38 & 0x7ff) * 4);
                    uVar38 = (int)uVar59 + (uint)*(ushort *)((long)wp + lVar39);
                    uVar59 = (ulong)uVar38;
                    uVar3 = *(undefined4 *)(lVar57 + (ulong)(uVar38 & 0x7ff) * 4);
                    *(undefined4 *)((long)op + (lVar39 + -4) * 2) =
                         *(undefined4 *)(lVar57 + (ulong)(uVar55 & 0x7ff) * 4);
                    *(undefined4 *)((long)op + (lVar39 + -2) * 2) = uVar4;
                    *(undefined4 *)((long)op + lVar39 * 2) = uVar3;
                    lVar39 = lVar39 + 6;
                    uVar42 = uVar42 - 3;
                  } while (6 < uVar42);
                }
              }
              else if (uVar42 == 4) {
                auVar69._8_8_ = 0;
                auVar69._0_8_ = *wp;
                auVar69 = auVar69 & auVar32;
                uVar3 = *(undefined4 *)(lVar57 + (ulong)auVar69._2_2_ * 4);
                uVar4 = *(undefined4 *)(lVar57 + (ulong)auVar69._4_2_ * 4);
                uVar5 = *(undefined4 *)(lVar57 + (ulong)auVar69._6_2_ * 4);
                *(undefined4 *)op = *(undefined4 *)(lVar57 + (ulong)auVar69._0_2_ * 4);
                *(undefined4 *)((long)op + 4) = uVar3;
                *(undefined4 *)((long)op + 8) = uVar4;
                *(undefined4 *)((long)op + 0xc) = uVar5;
                if (4 < uVar46) {
                  auVar16._10_2_ = 0;
                  auVar16._0_10_ = auVar69._0_10_;
                  auVar16._12_2_ = auVar69._6_2_;
                  auVar22._8_2_ = auVar69._4_2_;
                  auVar22._0_8_ = auVar69._0_8_;
                  auVar22._10_4_ = auVar16._10_4_;
                  auVar30._6_8_ = 0;
                  auVar30._0_6_ = auVar22._8_6_;
                  auVar70._6_8_ = SUB148(auVar30 << 0x40,6);
                  auVar70._4_2_ = auVar69._2_2_;
                  auVar70._2_2_ = 0;
                  auVar70._0_2_ = auVar69._0_2_;
                  auVar70._14_2_ = 0;
                  lVar39 = 8;
                  uVar42 = uVar36;
                  do {
                    uVar59 = *(ulong *)((long)wp + lVar39);
                    auVar17._8_4_ = 0;
                    auVar17._0_8_ = uVar59;
                    auVar17._12_2_ = (short)(uVar59 >> 0x30);
                    auVar23._8_2_ = (short)(uVar59 >> 0x20);
                    auVar23._0_8_ = uVar59;
                    auVar23._10_4_ = auVar17._10_4_;
                    auVar31._6_8_ = 0;
                    auVar31._0_6_ = auVar23._8_6_;
                    auVar71._0_4_ = auVar70._0_4_ + (uint)(ushort)uVar59;
                    auVar71._4_4_ =
                         auVar70._4_4_ +
                         (int)CONCAT82(SUB148(auVar31 << 0x40,6),(short)(uVar59 >> 0x10));
                    auVar71._8_4_ = auVar70._8_4_ + auVar23._8_4_;
                    auVar71._12_4_ = auVar70._12_4_ + (auVar17._10_4_ >> 0x10);
                    uVar3 = *(undefined4 *)(lVar57 + (ulong)(auVar71._4_4_ & 0x7ff) * 4);
                    uVar4 = *(undefined4 *)(lVar57 + (ulong)(auVar71._8_4_ & 0x7ff) * 4);
                    uVar5 = *(undefined4 *)(lVar57 + (ulong)(auVar71._12_4_ & 0x7ff) * 4);
                    *(undefined4 *)((long)op + lVar39 * 2) =
                         *(undefined4 *)(lVar57 + (ulong)(auVar71._0_4_ & 0x7ff) * 4);
                    *(undefined4 *)((long)op + (lVar39 + 2) * 2) = uVar3;
                    *(undefined4 *)((long)op + (lVar39 + 4) * 2) = uVar4;
                    *(undefined4 *)((long)op + (lVar39 + 6) * 2) = uVar5;
                    lVar39 = lVar39 + 8;
                    uVar42 = uVar42 - 4;
                    auVar70 = auVar71;
                  } while (8 < uVar42);
                }
              }
              else {
                uVar55 = uVar41 + 1;
                puVar60 = wp;
                puVar61 = (ushort *)op;
                uVar38 = uVar55;
                do {
                  *(undefined4 *)puVar61 =
                       *(undefined4 *)(lVar57 + (ulong)((ushort)*puVar60 & 0x7ff) * 4);
                  puVar60 = (ulong *)((long)puVar60 + 2);
                  puVar61 = puVar61 + 2;
                  uVar38 = uVar38 - 1;
                } while (1 < uVar38);
                if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
                  uVar38 = uVar55;
                  iVar35 = uVar46 - uVar42;
                  do {
                    do {
                      psVar2 = (short *)((long)puVar60 + (ulong)uVar41 * 2);
                      *psVar2 = *psVar2 + (short)*puVar60;
                      *(undefined4 *)puVar61 =
                           *(undefined4 *)(lVar57 + (ulong)((ushort)*puVar60 & 0x7ff) * 4);
                      puVar60 = (ulong *)((long)puVar60 + 2);
                      puVar61 = puVar61 + 2;
                      uVar38 = uVar38 - 1;
                    } while (1 < (int)uVar38);
                    iVar52 = iVar35 - (uint)uVar41;
                    bVar10 = (int)(uint)uVar41 <= iVar35;
                    uVar38 = uVar55;
                    iVar35 = iVar52;
                  } while (iVar52 != 0 && bVar10);
                }
              }
            }
            break;
          default:
            uVar41 = (tif->tif_dir).td_bitspersample;
            pcVar47 = "Unsupported bits/sample: %u";
            goto LAB_002ab9e5;
          }
          op = (uint8_t *)((long)op + lVar40);
          lVar50 = lVar50 + lVar49;
          wp = (ulong *)((long)wp + lVar11);
          puVar43 = puVar43 + lVar49;
        } while (lVar50 < occ);
      }
      return 1;
    }
    pcVar47 = "sp->stream.avail_out > sp->tbuf_size";
  }
  else {
    pcVar47 = "ZLib cannot deal with buffers this size";
  }
  TIFFErrorExtR(tif,"PixarLogDecode",pcVar47);
  return 0;
}

Assistant:

static int PixarLogDecode(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "PixarLogDecode";
    TIFFDirectory *td = &tif->tif_dir;
    PixarLogState *sp = DecoderState(tif);
    tmsize_t i;
    tmsize_t nsamples;
    int llen;
    uint16_t *up;

    switch (sp->user_datafmt)
    {
        case PIXARLOGDATAFMT_FLOAT:
            nsamples = occ / sizeof(float); /* XXX float == 32 bits */
            break;
        case PIXARLOGDATAFMT_16BIT:
        case PIXARLOGDATAFMT_12BITPICIO:
        case PIXARLOGDATAFMT_11BITLOG:
            nsamples = occ / sizeof(uint16_t); /* XXX uint16_t == 16 bits */
            break;
        case PIXARLOGDATAFMT_8BIT:
        case PIXARLOGDATAFMT_8BITABGR:
            nsamples = occ;
            break;
        default:
            TIFFErrorExtR(tif, module,
                          "%" PRIu16 " bit input not supported in PixarLog",
                          td->td_bitspersample);
            return 0;
    }

    llen = sp->stride * td->td_imagewidth;

    (void)s;
    assert(sp != NULL);

    sp->stream.next_in = tif->tif_rawcp;
    sp->stream.avail_in = (uInt)tif->tif_rawcc;

    sp->stream.next_out = (unsigned char *)sp->tbuf;
    assert(sizeof(sp->stream.avail_out) == 4); /* if this assert gets raised,
         we need to simplify this code to reflect a ZLib that is likely updated
         to deal with 8byte memory sizes, though this code will respond
         appropriately even before we simplify it */
    sp->stream.avail_out = (uInt)(nsamples * sizeof(uint16_t));
    if (sp->stream.avail_out != nsamples * sizeof(uint16_t))
    {
        TIFFErrorExtR(tif, module, "ZLib cannot deal with buffers this size");
        return (0);
    }
    /* Check that we will not fill more than what was allocated */
    if ((tmsize_t)sp->stream.avail_out > sp->tbuf_size)
    {
        TIFFErrorExtR(tif, module, "sp->stream.avail_out > sp->tbuf_size");
        return (0);
    }
    do
    {
        int state = inflate(&sp->stream, Z_PARTIAL_FLUSH);
        if (state == Z_STREAM_END)
        {
            break; /* XXX */
        }
        if (state == Z_DATA_ERROR)
        {
            TIFFErrorExtR(
                tif, module, "Decoding error at scanline %" PRIu32 ", %s",
                tif->tif_row, sp->stream.msg ? sp->stream.msg : "(null)");
            return (0);
        }
        if (state != Z_OK)
        {
            TIFFErrorExtR(tif, module, "ZLib error: %s",
                          sp->stream.msg ? sp->stream.msg : "(null)");
            return (0);
        }
    } while (sp->stream.avail_out > 0);

    /* hopefully, we got all the bytes we needed */
    if (sp->stream.avail_out != 0)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data at scanline %" PRIu32
                      " (short %u bytes)",
                      tif->tif_row, sp->stream.avail_out);
        return (0);
    }

    tif->tif_rawcp = sp->stream.next_in;
    tif->tif_rawcc = sp->stream.avail_in;

    up = sp->tbuf;
    /* Swap bytes in the data if from a different endian machine. */
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabArrayOfShort(up, nsamples);

    /*
     * if llen is not an exact multiple of nsamples, the decode operation
     * may overflow the output buffer, so truncate it enough to prevent
     * that but still salvage as much data as possible.
     */
    if (nsamples % llen)
    {
        TIFFWarningExtR(tif, module,
                        "stride %d is not a multiple of sample count, "
                        "%" TIFF_SSIZE_FORMAT ", data truncated.",
                        llen, nsamples);
        nsamples -= nsamples % llen;
    }

    for (i = 0; i < nsamples; i += llen, up += llen)
    {
        switch (sp->user_datafmt)
        {
            case PIXARLOGDATAFMT_FLOAT:
                horizontalAccumulateF(up, llen, sp->stride, (float *)op,
                                      sp->ToLinearF);
                op += llen * sizeof(float);
                break;
            case PIXARLOGDATAFMT_16BIT:
                horizontalAccumulate16(up, llen, sp->stride, (uint16_t *)op,
                                       sp->ToLinear16);
                op += llen * sizeof(uint16_t);
                break;
            case PIXARLOGDATAFMT_12BITPICIO:
                horizontalAccumulate12(up, llen, sp->stride, (int16_t *)op,
                                       sp->ToLinearF);
                op += llen * sizeof(int16_t);
                break;
            case PIXARLOGDATAFMT_11BITLOG:
                horizontalAccumulate11(up, llen, sp->stride, (uint16_t *)op);
                op += llen * sizeof(uint16_t);
                break;
            case PIXARLOGDATAFMT_8BIT:
                horizontalAccumulate8(up, llen, sp->stride, (unsigned char *)op,
                                      sp->ToLinear8);
                op += llen * sizeof(unsigned char);
                break;
            case PIXARLOGDATAFMT_8BITABGR:
                horizontalAccumulate8abgr(up, llen, sp->stride,
                                          (unsigned char *)op, sp->ToLinear8);
                op += llen * sizeof(unsigned char);
                break;
            default:
                TIFFErrorExtR(tif, module, "Unsupported bits/sample: %" PRIu16,
                              td->td_bitspersample);
                return (0);
        }
    }

    return (1);
}